

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O2

void __thiscall
vector_brodnik<unsigned_char_*>::~vector_brodnik(vector_brodnik<unsigned_char_*> *this)

{
  pointer pppuVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    pppuVar1 = (this->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_index_block).
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pppuVar1 >> 3) <=
        (ulong)uVar2) break;
    free(pppuVar1[uVar2]);
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>::~_Vector_base
            ((_Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)this);
  return;
}

Assistant:

~vector_brodnik()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
	}